

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O3

void __thiscall
booster::locale::localization_backend_manager::impl::add_backend
          (impl *this,string *name,
          unique_ptr<booster::locale::localization_backend,_std::default_delete<booster::locale::localization_backend>_>
          *backend_ptr)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer __s2;
  size_t __n;
  pointer piVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  shared_ptr<booster::locale::localization_backend> sptr;
  shared_ptr<booster::locale::localization_backend> sStack_78;
  string *local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
  local_60;
  
  std::__shared_ptr<booster::locale::localization_backend,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<booster::locale::localization_backend,std::default_delete<booster::locale::localization_backend>,void>
            ((__shared_ptr<booster::locale::localization_backend,(__gnu_cxx::_Lock_policy)2> *)
             &sStack_78,backend_ptr);
  ppVar1 = (this->all_backends_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->all_backends_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 == ppVar2) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::pair<std::shared_ptr<booster::locale::localization_backend>_&,_true>
              (&local_60,name,&sStack_78);
    std::
    vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>
              ((vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
                *)this,&local_60);
    if (local_60.second.
        super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.second.
                 super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
    piVar3 = (this->default_backends_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->default_backends_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar3;
    if (lVar5 != 0) {
      uVar6 = 0;
      do {
        piVar3[uVar6] = 0;
        uVar6 = uVar6 + 1;
      } while ((uVar6 & 0xffffffff) < (ulong)(lVar5 >> 2));
    }
  }
  else {
    uVar7 = ((long)ppVar2 - (long)ppVar1 >> 4) * -0x5555555555555555;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    uVar6 = 0;
    uVar8 = 1;
    local_68 = name;
    do {
      if (ppVar1[uVar6].first._M_string_length == __n) {
        if (__n == 0) goto LAB_00172414;
        iVar4 = bcmp(ppVar1[uVar6].first._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) goto LAB_00172414;
      }
      bVar9 = uVar8 <= uVar7;
      lVar5 = uVar7 - uVar8;
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar9 && lVar5 != 0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<booster::locale::localization_backend>_>
    ::pair<std::shared_ptr<booster::locale::localization_backend>_&,_true>
              (&local_60,local_68,&sStack_78);
    std::
    vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
    ::
    emplace_back<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>
              ((vector<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<booster::locale::localization_backend>>>>
                *)this,&local_60);
    if (local_60.second.
        super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.second.
                 super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
  }
LAB_00172414:
  if (sStack_78.
      super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_78.
               super___shared_ptr<booster::locale::localization_backend,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void add_backend(std::string const &name,std::unique_ptr<localization_backend> backend_ptr)
            {
                booster::shared_ptr<localization_backend> sptr(std::move(backend_ptr));
                if(all_backends_.empty()) {
                    all_backends_.push_back(std::make_pair(name,sptr));
                    for(unsigned i=0;i<default_backends_.size();i++)
                        default_backends_[i]=0;
                }
                else { 
                    for(unsigned i=0;i<all_backends_.size();i++)
                        if(all_backends_[i].first == name)
                            return;
                    all_backends_.push_back(std::make_pair(name,sptr));
                }
            }